

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O3

void __thiscall
Assimp::MD3Importer::InternReadFile
          (MD3Importer *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  string *psVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  _List_iterator<Assimp::Q3Shader::SkinData::TextureEntry> __it;
  long *__src;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ai_uint32 aVar9;
  undefined4 extraout_var;
  aiMesh **__s;
  aiMaterial **__s_00;
  Header *pHVar10;
  aiMesh *paVar11;
  Logger *pLVar12;
  size_t sVar13;
  aiMaterial *this_00;
  long *plVar14;
  undefined1 *puVar15;
  ulong *puVar16;
  aiFace *paVar17;
  aiVector3D *paVar18;
  uint *puVar19;
  aiNode *paVar20;
  aiNode **ppaVar21;
  long *plVar22;
  runtime_error *prVar23;
  long *plVar24;
  aiFace *paVar25;
  _func_int **pp_Var26;
  uchar *puVar27;
  iterator dit;
  ulong uVar28;
  _List_node_base *p_Var29;
  uchar *__s_01;
  ShaderDataBlock *shader;
  long lVar30;
  char *texture_name;
  MD3Importer *pMVar31;
  long lVar32;
  aiMatrix4x4 *paVar33;
  ulong uVar34;
  uchar *puVar35;
  char *pcVar36;
  _List_node_base *p_Var37;
  Surface *pcSurf;
  char *pcVar38;
  float fVar39;
  float __x;
  float fVar40;
  string convertedPath;
  int iMode;
  int no_alpha;
  string _texture_name;
  ShaderData shaders;
  SkinData skins;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer2;
  aiString name;
  aiString szString;
  uint local_9bc;
  string local_990;
  ulong local_970;
  char *local_968;
  float local_960;
  undefined4 local_95c;
  long *local_958;
  long local_950;
  long local_948;
  long lStack_940;
  undefined8 local_938;
  undefined4 local_930;
  uchar *local_928;
  ShaderDataBlock *local_920;
  char *local_918;
  char *local_910;
  long *local_908;
  long local_900;
  long local_8f8;
  long lStack_8f0;
  char *local_8e8;
  undefined8 local_8e0;
  char local_8d8;
  undefined7 uStack_8d7;
  _List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
  local_8c8;
  _List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
  local_8b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_898;
  ulong local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_878;
  char *local_870;
  ulong local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  undefined1 local_840 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_830 [6];
  MD3Importer local_7d0 [2];
  undefined1 local_438 [20];
  undefined1 uStack_424;
  undefined1 auStack_423 [1011];
  
  psVar1 = &this->mFile;
  std::__cxx11::string::_M_assign((string *)psVar1);
  this->mScene = pScene;
  this->mIOHandler = pIOHandler;
  std::__cxx11::string::find_last_of((char *)psVar1,0x6a184f,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)local_840,(ulong)psVar1);
  std::__cxx11::string::operator=((string *)&this->filename,(string *)local_840);
  std::__cxx11::string::substr((ulong)local_438,(ulong)psVar1);
  std::__cxx11::string::operator=((string *)&this->path,(string *)local_438);
  if ((undefined1 *)CONCAT44(local_438._4_4_,local_438._0_4_) != local_438 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_438._4_4_,local_438._0_4_),
                    CONCAT44(_uStack_424,local_438._16_4_) + 1);
  }
  if ((undefined1 *)local_840._0_8_ != local_840 + 0x10) {
    operator_delete((void *)local_840._0_8_,local_830[0]._M_allocated_capacity + 1);
  }
  if ((this->filename)._M_string_length != 0) {
    pcVar36 = (this->filename)._M_dataplus._M_p;
    do {
      iVar7 = tolower((int)*pcVar36);
      *pcVar36 = (char)iVar7;
      pcVar36 = pcVar36 + 1;
    } while (pcVar36 != (this->filename)._M_dataplus._M_p + (this->filename)._M_string_length);
  }
  if ((this->configHandleMP == false) || (bVar6 = ReadMultipartFile(this), !bVar6)) {
    local_840._0_8_ = local_840 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"rb","");
    iVar7 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_840._0_8_);
    plVar22 = (long *)CONCAT44(extraout_var,iVar7);
    if ((undefined1 *)local_840._0_8_ != local_840 + 0x10) {
      operator_delete((void *)local_840._0_8_,local_830[0]._M_allocated_capacity + 1);
    }
    if (plVar22 == (long *)0x0) {
      prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                     "Failed to open MD3 file ",pFile);
      plVar22 = (long *)std::__cxx11::string::append(local_438);
      local_840._0_8_ = *plVar22;
      pp_Var26 = (_func_int **)(plVar22 + 2);
      if ((_func_int **)local_840._0_8_ == pp_Var26) {
        local_830[0]._0_8_ = *pp_Var26;
        local_830[0]._8_8_ = plVar22[3];
        local_840._0_8_ = local_840 + 0x10;
      }
      else {
        local_830[0]._0_8_ = *pp_Var26;
      }
      local_840._8_8_ = plVar22[1];
      *plVar22 = (long)pp_Var26;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      std::runtime_error::runtime_error(prVar23,(string *)local_840);
      *(undefined ***)prVar23 = &PTR__runtime_error_007dd738;
      __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar8 = (**(code **)(*plVar22 + 0x30))(plVar22);
    this->fileSize = uVar8;
    if ((uVar8 & 0xfffffffc) < 0x6c) {
      prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_840._0_8_ = local_840 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_840,"MD3 File is too small.","");
      std::runtime_error::runtime_error(prVar23,(string *)local_840);
      *(undefined ***)prVar23 = &PTR__runtime_error_007dd738;
      __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_898,(ulong)uVar8,(allocator_type *)local_840);
    (**(code **)(*plVar22 + 0x10))
              (plVar22,local_898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,1,this->fileSize);
    this->mBuffer =
         local_898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    this->pcHeader =
         (Header *)
         local_898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    ValidateHeaderOffsets(this);
    pHVar10 = this->pcHeader;
    local_928 = this->mBuffer;
    uVar8 = pHVar10->OFS_SURFACES;
    uVar3 = pHVar10->NUM_SURFACES;
    local_880 = (ulong)pHVar10->OFS_TAGS;
    pScene->mNumMeshes = uVar3;
    uVar4 = this->pcHeader->NUM_SURFACES;
    if (uVar4 == 0) {
      prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_840._0_8_ = local_840 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"MD3: No surfaces","");
      std::runtime_error::runtime_error(prVar23,(string *)local_840);
      *(undefined ***)prVar23 = &PTR__runtime_error_007dd738;
      __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (0x31f38 < uVar4) {
      prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_840._0_8_ = local_840 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_840,"MD3: Too many surfaces, would run out of memory","");
      std::runtime_error::runtime_error(prVar23,(string *)local_840);
      *(undefined ***)prVar23 = &PTR__runtime_error_007dd738;
      __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar28 = (ulong)uVar3 << 3;
    __s = (aiMesh **)operator_new__(uVar28);
    pScene->mMeshes = __s;
    uVar3 = this->pcHeader->NUM_SURFACES;
    pScene->mNumMaterials = uVar3;
    __s_00 = (aiMaterial **)operator_new__(uVar28);
    pScene->mMaterials = __s_00;
    memset(__s,0,uVar28);
    memset(__s_00,0,(ulong)uVar3 << 3);
    local_8b0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_8b0;
    local_8b0._M_impl._M_node._M_size = 0;
    local_8b0._M_impl._M_node.super__List_node_base._M_prev =
         local_8b0._M_impl._M_node.super__List_node_base._M_next;
    ReadSkin(this,(SkinData *)local_8b0._M_impl._M_node.super__List_node_base._M_next);
    local_8c8._M_impl._M_node._M_size = 0;
    pMVar31 = this;
    local_8c8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_8c8;
    local_8c8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_8c8;
    ReadShader(this,(ShaderData *)&local_8c8);
    pHVar10 = this->pcHeader;
    pcVar36 = pHVar10->NAME;
    p_Var29 = local_8c8._M_impl._M_node.super__List_node_base._M_next;
    if (local_8c8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_8c8) {
      do {
        ConvertPath(pMVar31,(char *)p_Var29[1]._M_next,pcVar36,(string *)(p_Var29 + 1));
        p_Var37 = (_List_node_base *)&p_Var29[3]._M_prev;
        while (p_Var37 = p_Var37->_M_next, p_Var37 != (_List_node_base *)&p_Var29[3]._M_prev) {
          ConvertPath(pMVar31,(char *)p_Var37[1]._M_next,pcVar36,(string *)(p_Var37 + 1));
        }
        p_Var29 = p_Var29->_M_next;
      } while (p_Var29 != (_List_node_base *)&local_8c8);
      pHVar10 = this->pcHeader;
    }
    local_970 = (ulong)pHVar10->NUM_SURFACES;
    if (local_970 == 0) {
      local_9bc = 0;
      local_970 = 0;
    }
    else {
      pcSurf = (Surface *)(local_928 + uVar8);
      local_878 = &this->configSkinFile;
      local_9bc = 0;
      local_870 = pcVar36;
      do {
        ValidateSurfaceHeaderOffsets(this,pcSurf);
        local_970 = local_970 - 1;
        if ((pcSurf->NUM_VERTICES == 0) || (pcSurf->NUM_TRIANGLES == 0)) {
          iVar7 = pcSurf->OFS_END;
          pScene->mNumMeshes = pScene->mNumMeshes - 1;
        }
        else {
          local_910 = (char *)(ulong)pcSurf->OFS_XYZNORMAL;
          local_968 = (char *)(ulong)pcSurf->OFS_TRIANGLES;
          uVar8 = pcSurf->OFS_SHADERS;
          local_918 = (char *)(ulong)pcSurf->OFS_ST;
          paVar11 = (aiMesh *)operator_new(0x520);
          paVar11->mPrimitiveTypes = 0;
          paVar11->mNumVertices = 0;
          paVar11->mNumFaces = 0;
          memset(&paVar11->mVertices,0,0xcc);
          paVar11->mBones = (aiBone **)0x0;
          paVar11->mMaterialIndex = 0;
          (paVar11->mName).length = 0;
          (paVar11->mName).data[0] = '\0';
          memset((paVar11->mName).data + 1,0x1b,0x3ff);
          paVar11->mNumAnimMeshes = 0;
          paVar11->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar11->mMethod = 0;
          (paVar11->mAABB).mMin.x = 0.0;
          (paVar11->mAABB).mMin.y = 0.0;
          (paVar11->mAABB).mMin.z = 0.0;
          (paVar11->mAABB).mMax.x = 0.0;
          (paVar11->mAABB).mMax.y = 0.0;
          (paVar11->mAABB).mMax.z = 0.0;
          pMVar31 = (MD3Importer *)paVar11->mColors;
          memset(pMVar31,0,0xa0);
          pScene->mMeshes[local_970] = paVar11;
          paVar11 = pScene->mMeshes[local_970];
          local_8e8 = &local_8d8;
          local_8e0 = 0;
          local_8d8 = '\0';
          pcVar38 = pcSurf->NAME;
          local_840._0_8_ = pcVar38;
          for (__it._M_node = local_8b0._M_impl._M_node.super__List_node_base._M_next;
              __it._M_node != (_List_node_base *)&local_8b0; __it._M_node = (__it._M_node)->_M_next)
          {
            pMVar31 = (MD3Importer *)local_840;
            bVar6 = __gnu_cxx::__ops::_Iter_equals_val<char_const[64]>::operator()
                              ((_Iter_equals_val<char_const[64]> *)pMVar31,__it);
            if (bVar6) break;
          }
          if (__it._M_node == (_List_node_base *)&local_8b0) {
LAB_003eec62:
            if (pcSurf->NUM_SHADER != 0) {
              texture_name = pcSurf->NAME + ((ulong)uVar8 - 4);
              goto LAB_003eec73;
            }
            local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
            local_990._M_string_length = 0;
            local_990.field_2._M_local_buf[0] = '\0';
          }
          else {
            std::__cxx11::string::_M_assign((string *)&local_8e8);
            texture_name = local_8e8;
            pLVar12 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[29]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_840,(char (*) [29])"MD3: Assigning skin texture ");
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_840,(char *)__it._M_node[3]._M_next,
                       (long)__it._M_node[3]._M_prev);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_840," to surface ",0xc);
            sVar13 = strlen(pcVar38);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_840,pcVar38,sVar13);
            std::__cxx11::stringbuf::str();
            Logger::debug(pLVar12,(char *)local_438._0_8_);
            if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
              operator_delete((void *)local_438._0_8_,CONCAT44(_uStack_424,local_438._16_4_) + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
            pMVar31 = local_7d0;
            std::ios_base::~ios_base((ios_base *)pMVar31);
            *(undefined1 *)&__it._M_node[5]._M_next = 1;
            if (texture_name == (char *)0x0) goto LAB_003eec62;
LAB_003eec73:
            local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
            local_990._M_string_length = 0;
            local_990.field_2._M_local_buf[0] = '\0';
            ConvertPath(pMVar31,texture_name,pcVar36,&local_990);
          }
          pcVar38 = local_438 + 0x10;
          if (local_8c8._M_impl._M_node.super__List_node_base._M_next ==
              (_List_node_base *)&local_8c8) {
            shader = (ShaderDataBlock *)0x0;
          }
          else {
            std::__cxx11::string::rfind((char)&local_990,0x2e);
            std::__cxx11::string::substr((ulong)local_840,(ulong)&local_990);
            for (p_Var29 = local_8c8._M_impl._M_node.super__List_node_base._M_next;
                p_Var29 != (_List_node_base *)&local_8c8;
                p_Var29 = (((list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                             *)&p_Var29->_M_next)->
                          super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                          )._M_impl._M_node.super__List_node_base._M_next) {
              bVar6 = Q3Shader::ShaderDataBlock::operator==
                                ((ShaderDataBlock *)(p_Var29 + 1),(string *)local_840);
              if (bVar6) break;
            }
            if (p_Var29 == (_List_node_base *)&local_8c8) {
              pLVar12 = DefaultLogger::get();
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_438,"Unable to find shader record for ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_840);
              Logger::warn(pLVar12,(char *)local_438._0_8_);
              if ((char *)local_438._0_8_ != pcVar38) {
                operator_delete((void *)local_438._0_8_,CONCAT44(_uStack_424,local_438._16_4_) + 1);
              }
              shader = (ShaderDataBlock *)0x0;
            }
            else {
              pLVar12 = DefaultLogger::get();
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_438,"Found shader record for ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_840);
              Logger::info(pLVar12,(char *)local_438._0_8_);
              if ((char *)local_438._0_8_ != pcVar38) {
                operator_delete((void *)local_438._0_8_,CONCAT44(_uStack_424,local_438._16_4_) + 1);
              }
              shader = (ShaderDataBlock *)(p_Var29 + 1);
            }
            if ((undefined1 *)local_840._0_8_ != local_840 + 0x10) {
              operator_delete((void *)local_840._0_8_,local_830[0]._M_allocated_capacity + 1);
            }
          }
          this_00 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_00);
          local_95c = 2;
          aiMaterial::AddBinaryProperty(this_00,&local_95c,4,"$mat.shadingm",0,0,aiPTI_Integer);
          local_938 = 0x3d4ccccd3d4ccccd;
          local_930 = 0x3d4ccccd;
          aiMaterial::AddBinaryProperty(this_00,&local_938,0xc,"$clr.ambient",0,0,aiPTI_Float);
          local_938 = 0x3f8000003f800000;
          local_930 = 0x3f800000;
          aiMaterial::AddBinaryProperty(this_00,&local_938,0xc,"$clr.diffuse",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty(this_00,&local_938,0xc,"$clr.specular",0,0,aiPTI_Float);
          local_840._0_8_ = local_840._0_8_ & 0xffffff0000000000;
          memset(local_840 + 5,0x1b,0x3ff);
          std::operator+(&local_860,"MD3_[",local_878);
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_860);
          local_908 = &local_8f8;
          plVar24 = plVar14 + 2;
          if ((long *)*plVar14 == plVar24) {
            local_8f8 = *plVar24;
            lStack_8f0 = plVar14[3];
          }
          else {
            local_8f8 = *plVar24;
            local_908 = (long *)*plVar14;
          }
          local_900 = plVar14[1];
          *plVar14 = (long)plVar24;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_908);
          local_958 = &local_948;
          plVar24 = plVar14 + 2;
          if ((long *)*plVar14 == plVar24) {
            local_948 = *plVar24;
            lStack_940 = plVar14[3];
          }
          else {
            local_948 = *plVar24;
            local_958 = (long *)*plVar14;
          }
          local_950 = plVar14[1];
          *plVar14 = (long)plVar24;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_958);
          plVar24 = plVar14 + 2;
          if ((long *)*plVar14 == plVar24) {
            auStack_423._3_8_ = plVar14[3];
            local_438._16_4_ = (undefined4)*plVar24;
            _uStack_424 = (undefined4)((ulong)*plVar24 >> 0x20);
            __src = (long *)pcVar38;
          }
          else {
            local_438._16_4_ = (undefined4)*plVar24;
            _uStack_424 = (undefined4)((ulong)*plVar24 >> 0x20);
            __src = (long *)*plVar14;
          }
          uVar28 = plVar14[1];
          local_438._8_4_ = (undefined4)uVar28;
          local_438._12_4_ = (undefined4)(uVar28 >> 0x20);
          *plVar14 = (long)plVar24;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          local_438._0_8_ = __src;
          if (uVar28 < 0x400) {
            local_840._0_4_ = local_438._8_4_;
            memcpy(local_840 + 4,__src,uVar28);
            local_840[uVar28 + 4] = 0;
          }
          if (__src != (long *)pcVar38) {
            operator_delete(__src,CONCAT44(_uStack_424,local_438._16_4_) + 1);
          }
          if (local_958 != &local_948) {
            operator_delete(local_958,local_948 + 1);
          }
          if (local_908 != &local_8f8) {
            operator_delete(local_908,local_8f8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_860._M_dataplus._M_p != &local_860.field_2) {
            operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
          }
          aiMaterial::AddProperty(this_00,(aiString *)local_840,"?mat.name",0,0);
          if (shader == (ShaderDataBlock *)0x0) {
            local_438._0_4_ = 0;
            local_438._4_4_ = local_438._4_4_ & 0xffffff00;
            memset(local_438 + 5,0x1b,0x3ff);
            sVar5 = local_990._M_string_length;
            if (local_990._M_string_length == 0) {
              pLVar12 = DefaultLogger::get();
              Logger::warn(pLVar12,"Texture file name has zero length. Using default name");
              local_438._0_4_ = 0x11;
              local_438._4_4_ = 0x6d6d7564;
              local_438[8] = 'y';
              local_438[9] = '_';
              local_438[10] = 't';
              local_438[0xb] = 'e';
              local_438[0xc] = 'x';
              local_438[0xd] = 't';
              local_438[0xe] = 'u';
              local_438[0xf] = 'r';
              local_438._16_4_ = 0x6d622e65;
              uStack_424 = 0x70;
              puVar15 = auStack_423;
LAB_003ef234:
              *puVar15 = 0;
            }
            else if (local_990._M_string_length < 0x400) {
              local_438._0_4_ = (undefined4)local_990._M_string_length;
              memcpy(local_438 + 4,local_990._M_dataplus._M_p,local_990._M_string_length);
              puVar15 = local_438 + sVar5 + 4;
              goto LAB_003ef234;
            }
            aiMaterial::AddProperty(this_00,(aiString *)local_438,"$tex.file",1,0);
            local_958 = (long *)CONCAT44(local_958._4_4_,4);
            aiMaterial::AddBinaryProperty(this_00,&local_958,4,"$tex.flags",1,0,aiPTI_Integer);
          }
          else {
            Q3Shader::ConvertShaderToMaterial(this_00,shader);
          }
          pScene->mMaterials[local_9bc] = this_00;
          paVar11->mMaterialIndex = local_9bc;
          paVar11->mPrimitiveTypes = 4;
          paVar11->mNumVertices = pcSurf->NUM_TRIANGLES * 3;
          uVar28 = (ulong)pcSurf->NUM_TRIANGLES;
          paVar11->mNumFaces = pcSurf->NUM_TRIANGLES;
          puVar16 = (ulong *)operator_new__(uVar28 * 0x10 + 8);
          *puVar16 = uVar28;
          paVar17 = (aiFace *)(puVar16 + 1);
          if (uVar28 != 0) {
            paVar25 = paVar17;
            do {
              paVar25->mNumIndices = 0;
              paVar25->mIndices = (uint *)0x0;
              paVar25 = paVar25 + 1;
            } while (paVar25 != paVar17 + uVar28);
          }
          paVar11->mFaces = paVar17;
          uVar8 = paVar11->mNumVertices;
          uVar28 = (ulong)uVar8 * 0xc;
          paVar18 = (aiVector3D *)operator_new__(uVar28);
          if (uVar8 != 0) {
            memset(paVar18,0,((uVar28 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar11->mNormals = paVar18;
          uVar8 = paVar11->mNumVertices;
          uVar28 = (ulong)uVar8 * 0xc;
          paVar18 = (aiVector3D *)operator_new__(uVar28);
          if (uVar8 != 0) {
            memset(paVar18,0,((uVar28 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar11->mVertices = paVar18;
          uVar8 = paVar11->mNumVertices;
          uVar28 = (ulong)uVar8 * 0xc;
          paVar18 = (aiVector3D *)operator_new__(uVar28);
          local_920 = shader;
          if (uVar8 != 0) {
            memset(paVar18,0,((uVar28 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar11->mTextureCoords[0] = paVar18;
          paVar11->mNumUVComponents[0] = 2;
          if (pcSurf->NUM_TRIANGLES != 0) {
            local_910 = pcSurf->NAME + (long)(local_910 + -4);
            local_968 = pcSurf->NAME + (long)(local_968 + -4);
            local_918 = pcSurf->NAME + (long)(local_918 + -4);
            uVar28 = 0;
            iVar7 = 0;
            do {
              puVar19 = (uint *)operator_new__(0xc);
              paVar11->mFaces[uVar28].mIndices = puVar19;
              paVar11->mFaces[uVar28].mNumIndices = 3;
              lVar30 = 0;
              local_868 = uVar28;
              do {
                uVar8 = iVar7 + (int)lVar30;
                paVar11->mFaces[uVar28].mIndices[lVar30] = uVar8;
                uVar34 = (ulong)*(uint *)(local_968 + lVar30 * 4);
                if (pcSurf->NUM_VERTICES <= *(uint *)(local_968 + lVar30 * 4)) {
                  prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_438._0_8_ = local_438 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_438,"MD3: Invalid vertex index","");
                  std::runtime_error::runtime_error(prVar23,(string *)local_438);
                  *(undefined ***)prVar23 = &PTR__runtime_error_007dd738;
                  __cxa_throw(prVar23,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                paVar18 = paVar11->mVertices;
                paVar18[uVar8].x = (float)(int)*(short *)(local_910 + uVar34 * 8) * 0.015625;
                paVar18[uVar8].y = (float)(int)*(short *)(local_910 + uVar34 * 8 + 2) * 0.015625;
                paVar18[uVar8].z = (float)(int)*(short *)(local_910 + uVar34 * 8 + 4) * 0.015625;
                paVar18 = paVar11->mNormals;
                fVar40 = (float)(*(ushort *)(local_910 + uVar34 * 8 + 6) >> 8) * 0.024546297;
                __x = (float)(byte)*(ushort *)(local_910 + uVar34 * 8 + 6) * 0.024546297;
                local_960 = cosf(fVar40);
                fVar39 = sinf(__x);
                paVar18[uVar8].x = fVar39 * local_960;
                fVar39 = sinf(fVar40);
                fVar40 = sinf(__x);
                paVar18[uVar8].y = fVar40 * fVar39;
                fVar39 = cosf(__x);
                paVar18[uVar8].z = fVar39;
                paVar11->mTextureCoords[0][uVar8].x = *(float *)(local_918 + uVar34 * 8);
                paVar11->mTextureCoords[0][uVar8].y = 1.0 - *(float *)(local_918 + uVar34 * 8 + 4);
                lVar30 = lVar30 + 1;
              } while (lVar30 != 3);
              if ((local_920 == (ShaderDataBlock *)0x0) || (local_920->cull == CULL_CW)) {
                puVar19 = paVar11->mFaces[uVar28].mIndices;
                uVar2 = *(undefined8 *)(puVar19 + 1);
                *(ulong *)(puVar19 + 1) = CONCAT44((int)uVar2,(int)((ulong)uVar2 >> 0x20));
              }
              iVar7 = iVar7 + 3;
              local_968 = local_968 + 0xc;
              uVar28 = local_868 + 1;
              pcVar36 = local_870;
            } while (uVar28 < pcSurf->NUM_TRIANGLES);
          }
          iVar7 = pcSurf->OFS_END;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_990._M_dataplus._M_p != &local_990.field_2) {
            operator_delete(local_990._M_dataplus._M_p,
                            CONCAT71(local_990.field_2._M_allocated_capacity._1_7_,
                                     local_990.field_2._M_local_buf[0]) + 1);
          }
          if (local_8e8 != &local_8d8) {
            operator_delete(local_8e8,CONCAT71(uStack_8d7,local_8d8) + 1);
          }
          local_9bc = local_9bc + 1;
        }
        pcSurf = (Surface *)(pcSurf->NAME + (long)iVar7 + -4);
      } while (local_970 != 0);
    }
    bVar6 = DefaultLogger::isNullLogger();
    if ((!bVar6) &&
       (local_8b0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_8b0)) {
      p_Var29 = local_8b0._M_impl._M_node.super__List_node_base._M_next;
      do {
        if (*(char *)&p_Var29[5]._M_next == '\0') {
          pLVar12 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[27]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_840,(char (*) [27])"MD3: Failed to match skin ");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_840,(char *)p_Var29[1]._M_next,(long)p_Var29[1]._M_prev);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_840," to surface ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_840,
                     (char *)(((list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                                *)&p_Var29[3]._M_next)->
                             super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                             )._M_impl._M_node.super__List_node_base._M_next,
                     (long)p_Var29[3]._M_prev);
          std::__cxx11::stringbuf::str();
          Logger::error(pLVar12,(char *)local_438._0_8_);
          if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
            operator_delete((void *)local_438._0_8_,CONCAT44(_uStack_424,local_438._16_4_) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
          std::ios_base::~ios_base((ios_base *)local_7d0);
        }
        p_Var29 = (((list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                     *)&p_Var29->_M_next)->
                  super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
      } while (p_Var29 != (_List_node_base *)&local_8b0);
    }
    if (pScene->mNumMeshes == 0) {
      prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_840._0_8_ = local_840 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_840,"MD3: File contains no valid mesh","");
      std::runtime_error::runtime_error(prVar23,(string *)local_840);
      *(undefined ***)prVar23 = &PTR__runtime_error_007dd738;
      __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pScene->mNumMaterials = local_9bc;
    paVar20 = (aiNode *)operator_new(0x478);
    local_840._0_8_ = local_840 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"<MD3Root>","");
    aiNode::aiNode(paVar20,(string *)local_840);
    pScene->mRootNode = paVar20;
    if ((undefined1 *)local_840._0_8_ != local_840 + 0x10) {
      operator_delete((void *)local_840._0_8_,local_830[0]._M_allocated_capacity + 1);
      paVar20 = pScene->mRootNode;
    }
    uVar8 = pScene->mNumMeshes;
    paVar20->mNumMeshes = uVar8;
    puVar19 = (uint *)operator_new__((ulong)uVar8 << 2);
    pScene->mRootNode->mMeshes = puVar19;
    uVar8 = this->pcHeader->NUM_TAGS;
    if (uVar8 != 0) {
      pScene->mRootNode->mNumChildren = uVar8;
      ppaVar21 = (aiNode **)operator_new__((ulong)this->pcHeader->NUM_TAGS << 3);
      pScene->mRootNode->mChildren = ppaVar21;
      if (this->pcHeader->NUM_TAGS != 0) {
        __s_01 = local_928 + local_880;
        puVar35 = local_928 + local_880 + 0x4c;
        uVar28 = 0;
        do {
          paVar20 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar20);
          pScene->mRootNode->mChildren[uVar28] = paVar20;
          sVar13 = strlen((char *)__s_01);
          aVar9 = (ai_uint32)sVar13;
          if ((int)aVar9 < 0x400) {
            (paVar20->mName).length = aVar9;
            memcpy((paVar20->mName).data,__s_01,(long)(int)aVar9);
            (paVar20->mName).data[(int)aVar9] = '\0';
          }
          paVar20->mParent = pScene->mRootNode;
          (paVar20->mTransformation).a4 = *(float *)(__s_01 + 0x40);
          (paVar20->mTransformation).b4 = *(float *)(__s_01 + 0x44);
          (paVar20->mTransformation).c4 = *(float *)(__s_01 + 0x48);
          lVar30 = 0;
          puVar27 = puVar35;
          do {
            lVar32 = 0;
            do {
              paVar33 = &paVar20->mTransformation;
              if (((int)lVar32 != 0) &&
                 (paVar33 = (aiMatrix4x4 *)&(paVar20->mTransformation).c1, (int)lVar32 != 2)) {
                paVar33 = (aiMatrix4x4 *)&(paVar20->mTransformation).b1;
              }
              (&paVar33->a1)[lVar30] = *(float *)(puVar27 + lVar32 * 4);
              lVar32 = lVar32 + 1;
            } while (lVar32 != 3);
            lVar30 = lVar30 + 1;
            puVar27 = puVar27 + 0xc;
          } while (lVar30 != 3);
          uVar28 = uVar28 + 1;
          __s_01 = __s_01 + 0x70;
          puVar35 = puVar35 + 0x70;
        } while (uVar28 < this->pcHeader->NUM_TAGS);
      }
    }
    if (pScene->mNumMeshes != 0) {
      uVar28 = 0;
      do {
        pScene->mRootNode->mMeshes[uVar28] = (uint)uVar28;
        uVar28 = uVar28 + 1;
      } while (uVar28 < pScene->mNumMeshes);
    }
    paVar20 = pScene->mRootNode;
    (paVar20->mTransformation).a1 = 1.0;
    (paVar20->mTransformation).a2 = 0.0;
    (paVar20->mTransformation).a3 = 0.0;
    (paVar20->mTransformation).a4 = 0.0;
    (paVar20->mTransformation).b1 = 0.0;
    (paVar20->mTransformation).b2 = 0.0;
    (paVar20->mTransformation).b3 = 1.0;
    (paVar20->mTransformation).b4 = 0.0;
    (paVar20->mTransformation).c1 = 0.0;
    (paVar20->mTransformation).c2 = -1.0;
    (paVar20->mTransformation).c3 = 0.0;
    (paVar20->mTransformation).c4 = 0.0;
    (paVar20->mTransformation).d1 = 0.0;
    (paVar20->mTransformation).d2 = 0.0;
    (paVar20->mTransformation).d3 = 0.0;
    (paVar20->mTransformation).d4 = 1.0;
    std::__cxx11::
    _List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
    ::_M_clear(&local_8c8);
    std::__cxx11::
    _List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
    ::_M_clear(&local_8b0);
    if ((Header *)
        local_898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (Header *)0x0) {
      operator_delete(local_898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_898.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_898.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    (**(code **)(*plVar22 + 8))();
  }
  return;
}

Assistant:

void MD3Importer::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    mFile = pFile;
    mScene = pScene;
    mIOHandler = pIOHandler;

    // get base path and file name
    // todo ... move to PathConverter
    std::string::size_type s = mFile.find_last_of("/\\");
    if (s == std::string::npos) {
        s = 0;
    } else {
        ++s;
    }
    filename = mFile.substr(s), path = mFile.substr(0, s);
    for (std::string::iterator it = filename.begin(); it != filename.end(); ++it) {
        *it = static_cast<char>( tolower(*it) );
    }

    // Load multi-part model file, if necessary
    if (configHandleMP) {
        if (ReadMultipartFile())
            return;
    }

    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open MD3 file " + pFile + ".");

    // Check whether the md3 file is large enough to contain the header
    fileSize = (unsigned int)file->FileSize();
    if( fileSize < sizeof(MD3::Header))
        throw DeadlyImportError( "MD3 File is too small.");

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector<unsigned char> mBuffer2 (fileSize);
    file->Read( &mBuffer2[0], 1, fileSize);
    mBuffer = &mBuffer2[0];

    pcHeader = (BE_NCONST MD3::Header*)mBuffer;

    // Ensure correct endianness
#ifdef AI_BUILD_BIG_ENDIAN

    AI_SWAP4(pcHeader->VERSION);
    AI_SWAP4(pcHeader->FLAGS);
    AI_SWAP4(pcHeader->IDENT);
    AI_SWAP4(pcHeader->NUM_FRAMES);
    AI_SWAP4(pcHeader->NUM_SKINS);
    AI_SWAP4(pcHeader->NUM_SURFACES);
    AI_SWAP4(pcHeader->NUM_TAGS);
    AI_SWAP4(pcHeader->OFS_EOF);
    AI_SWAP4(pcHeader->OFS_FRAMES);
    AI_SWAP4(pcHeader->OFS_SURFACES);
    AI_SWAP4(pcHeader->OFS_TAGS);

#endif

    // Validate the file header
    ValidateHeaderOffsets();

    // Navigate to the list of surfaces
    BE_NCONST MD3::Surface* pcSurfaces = (BE_NCONST MD3::Surface*)(mBuffer + pcHeader->OFS_SURFACES);

    // Navigate to the list of tags
    BE_NCONST MD3::Tag* pcTags = (BE_NCONST MD3::Tag*)(mBuffer + pcHeader->OFS_TAGS);

    // Allocate output storage
    pScene->mNumMeshes = pcHeader->NUM_SURFACES;
    if (pcHeader->NUM_SURFACES == 0) {
        throw DeadlyImportError("MD3: No surfaces");
    } else if (pcHeader->NUM_SURFACES > AI_MAX_ALLOC(aiMesh)) {
        // We allocate pointers but check against the size of aiMesh
        // since those pointers will eventually have to point to real objects
        throw DeadlyImportError("MD3: Too many surfaces, would run out of memory");
    }
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    pScene->mNumMaterials = pcHeader->NUM_SURFACES;
    pScene->mMaterials = new aiMaterial*[pScene->mNumMeshes];

    // Set arrays to zero to ensue proper destruction if an exception is raised
    ::memset(pScene->mMeshes,0,pScene->mNumMeshes*sizeof(aiMesh*));
    ::memset(pScene->mMaterials,0,pScene->mNumMaterials*sizeof(aiMaterial*));

    // Now read possible skins from .skin file
    Q3Shader::SkinData skins;
    ReadSkin(skins);

    // And check whether we can locate a shader file for this model
    Q3Shader::ShaderData shaders;
    ReadShader(shaders);

    // Adjust all texture paths in the shader
    const char* header_name = pcHeader->NAME;
    if (!shaders.blocks.empty()) {
        for (std::list< Q3Shader::ShaderDataBlock >::iterator dit = shaders.blocks.begin(); dit != shaders.blocks.end(); ++dit) {
            ConvertPath((*dit).name.c_str(),header_name,(*dit).name);

            for (std::list< Q3Shader::ShaderMapBlock >::iterator mit = (*dit).maps.begin(); mit != (*dit).maps.end(); ++mit) {
                ConvertPath((*mit).name.c_str(),header_name,(*mit).name);
            }
        }
    }

    // Read all surfaces from the file
    unsigned int iNum = pcHeader->NUM_SURFACES;
    unsigned int iNumMaterials = 0;
    while (iNum-- > 0)  {

        // Ensure correct endianness
#ifdef AI_BUILD_BIG_ENDIAN

        AI_SWAP4(pcSurfaces->FLAGS);
        AI_SWAP4(pcSurfaces->IDENT);
        AI_SWAP4(pcSurfaces->NUM_FRAMES);
        AI_SWAP4(pcSurfaces->NUM_SHADER);
        AI_SWAP4(pcSurfaces->NUM_TRIANGLES);
        AI_SWAP4(pcSurfaces->NUM_VERTICES);
        AI_SWAP4(pcSurfaces->OFS_END);
        AI_SWAP4(pcSurfaces->OFS_SHADERS);
        AI_SWAP4(pcSurfaces->OFS_ST);
        AI_SWAP4(pcSurfaces->OFS_TRIANGLES);
        AI_SWAP4(pcSurfaces->OFS_XYZNORMAL);

#endif

        // Validate the surface header
        ValidateSurfaceHeaderOffsets(pcSurfaces);

        // Navigate to the vertex list of the surface
        BE_NCONST MD3::Vertex* pcVertices = (BE_NCONST MD3::Vertex*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_XYZNORMAL);

        // Navigate to the triangle list of the surface
        BE_NCONST MD3::Triangle* pcTriangles = (BE_NCONST MD3::Triangle*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_TRIANGLES);

        // Navigate to the texture coordinate list of the surface
        BE_NCONST MD3::TexCoord* pcUVs = (BE_NCONST MD3::TexCoord*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_ST);

        // Navigate to the shader list of the surface
        BE_NCONST MD3::Shader* pcShaders = (BE_NCONST MD3::Shader*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_SHADERS);

        // If the submesh is empty ignore it
        if (0 == pcSurfaces->NUM_VERTICES || 0 == pcSurfaces->NUM_TRIANGLES)
        {
            pcSurfaces = (BE_NCONST MD3::Surface*)(((uint8_t*)pcSurfaces) + pcSurfaces->OFS_END);
            pScene->mNumMeshes--;
            continue;
        }

        // Allocate output mesh
        pScene->mMeshes[iNum] = new aiMesh();
        aiMesh* pcMesh = pScene->mMeshes[iNum];

        std::string _texture_name;
        const char* texture_name = NULL;

        // Check whether we have a texture record for this surface in the .skin file
        std::list< Q3Shader::SkinData::TextureEntry >::iterator it = std::find(
            skins.textures.begin(), skins.textures.end(), pcSurfaces->NAME );

        if (it != skins.textures.end()) {
            texture_name = &*( _texture_name = (*it).second).begin();
            ASSIMP_LOG_DEBUG_F("MD3: Assigning skin texture ", (*it).second, " to surface ", pcSurfaces->NAME);
            (*it).resolved = true; // mark entry as resolved
        }

        // Get the first shader (= texture?) assigned to the surface
        if (!texture_name && pcSurfaces->NUM_SHADER)    {
            texture_name = pcShaders->NAME;
        }

        std::string convertedPath;
        if (texture_name) {
            ConvertPath(texture_name,header_name,convertedPath);
        }

        const Q3Shader::ShaderDataBlock* shader = NULL;

        // Now search the current shader for a record with this name (
        // excluding texture file extension)
        if (!shaders.blocks.empty()) {
            std::string::size_type sh = convertedPath.find_last_of('.');
            if (sh == std::string::npos) {
                sh = convertedPath.length();
            }

            const std::string without_ext = convertedPath.substr(0,sh);
            std::list< Q3Shader::ShaderDataBlock >::const_iterator dit = std::find(shaders.blocks.begin(),shaders.blocks.end(),without_ext);
            if (dit != shaders.blocks.end()) {
                // We made it!
                shader = &*dit;
                ASSIMP_LOG_INFO("Found shader record for " +without_ext );
            } else {
                ASSIMP_LOG_WARN("Unable to find shader record for " + without_ext);
            }
        }

        aiMaterial* pcHelper = new aiMaterial();

        const int iMode = (int)aiShadingMode_Gouraud;
        pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        // Add a small ambient color value - Quake 3 seems to have one
        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        clr.b = clr.g = clr.r = 1.0f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        // use surface name + skin_name as material name
        aiString name;
        name.Set("MD3_[" + configSkinFile + "][" + pcSurfaces->NAME + "]");
        pcHelper->AddProperty(&name,AI_MATKEY_NAME);

        if (!shader) {
            // Setup dummy texture file name to ensure UV coordinates are kept during postprocessing
            aiString szString;
            if (convertedPath.length()) {
                szString.Set(convertedPath);
            } else    {
                ASSIMP_LOG_WARN("Texture file name has zero length. Using default name");
                szString.Set("dummy_texture.bmp");
            }
            pcHelper->AddProperty(&szString,AI_MATKEY_TEXTURE_DIFFUSE(0));

            // prevent transparency by default
            int no_alpha = aiTextureFlags_IgnoreAlpha;
            pcHelper->AddProperty(&no_alpha,1,AI_MATKEY_TEXFLAGS_DIFFUSE(0));
        } else {
            Q3Shader::ConvertShaderToMaterial(pcHelper,*shader);
        }

        pScene->mMaterials[iNumMaterials] = (aiMaterial*)pcHelper;
        pcMesh->mMaterialIndex = iNumMaterials++;

            // Ensure correct endianness
#ifdef AI_BUILD_BIG_ENDIAN

        for (uint32_t i = 0; i < pcSurfaces->NUM_VERTICES;++i)  {
            AI_SWAP2( pcVertices[i].NORMAL );
            AI_SWAP2( pcVertices[i].X );
            AI_SWAP2( pcVertices[i].Y );
            AI_SWAP2( pcVertices[i].Z );

            AI_SWAP4( pcUVs[i].U );
            AI_SWAP4( pcUVs[i].U );
        }
        for (uint32_t i = 0; i < pcSurfaces->NUM_TRIANGLES;++i) {
            AI_SWAP4(pcTriangles[i].INDEXES[0]);
            AI_SWAP4(pcTriangles[i].INDEXES[1]);
            AI_SWAP4(pcTriangles[i].INDEXES[2]);
        }

#endif

        // Fill mesh information
        pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        pcMesh->mNumVertices        = pcSurfaces->NUM_TRIANGLES*3;
        pcMesh->mNumFaces           = pcSurfaces->NUM_TRIANGLES;
        pcMesh->mFaces              = new aiFace[pcSurfaces->NUM_TRIANGLES];
        pcMesh->mNormals            = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mVertices           = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mTextureCoords[0]   = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mNumUVComponents[0] = 2;

        // Fill in all triangles
        unsigned int iCurrent = 0;
        for (unsigned int i = 0; i < (unsigned int)pcSurfaces->NUM_TRIANGLES;++i)   {
            pcMesh->mFaces[i].mIndices = new unsigned int[3];
            pcMesh->mFaces[i].mNumIndices = 3;

            //unsigned int iTemp = iCurrent;
            for (unsigned int c = 0; c < 3;++c,++iCurrent)  {
                pcMesh->mFaces[i].mIndices[c] = iCurrent;

                // Read vertices
                aiVector3D& vec = pcMesh->mVertices[iCurrent];
                uint32_t index = pcTriangles->INDEXES[c];
                if (index >= pcSurfaces->NUM_VERTICES) {
                    throw DeadlyImportError( "MD3: Invalid vertex index");
                }
                vec.x = pcVertices[index].X*AI_MD3_XYZ_SCALE;
                vec.y = pcVertices[index].Y*AI_MD3_XYZ_SCALE;
                vec.z = pcVertices[index].Z*AI_MD3_XYZ_SCALE;

                // Convert the normal vector to uncompressed float3 format
                aiVector3D& nor = pcMesh->mNormals[iCurrent];
                LatLngNormalToVec3(pcVertices[index].NORMAL,(ai_real*)&nor);

                // Read texture coordinates
                pcMesh->mTextureCoords[0][iCurrent].x = pcUVs[index].U;
                pcMesh->mTextureCoords[0][iCurrent].y = 1.0f-pcUVs[index].V;
            }
            // Flip face order if necessary
            if (!shader || shader->cull == Q3Shader::CULL_CW) {
                std::swap(pcMesh->mFaces[i].mIndices[2],pcMesh->mFaces[i].mIndices[1]);
            }
            ++pcTriangles;
        }

        // Go to the next surface
        pcSurfaces = (BE_NCONST MD3::Surface*)(((unsigned char*)pcSurfaces) + pcSurfaces->OFS_END);
    }

    // For debugging purposes: check whether we found matches for all entries in the skins file
    if (!DefaultLogger::isNullLogger()) {
        for (std::list< Q3Shader::SkinData::TextureEntry>::const_iterator it = skins.textures.begin();it != skins.textures.end(); ++it) {
            if (!(*it).resolved) {
                ASSIMP_LOG_ERROR_F("MD3: Failed to match skin ", (*it).first, " to surface ", (*it).second);
            }
        }
    }

    if (!pScene->mNumMeshes) {
        throw DeadlyImportError( "MD3: File contains no valid mesh");
    }
    pScene->mNumMaterials = iNumMaterials;

    // Now we need to generate an empty node graph
    pScene->mRootNode = new aiNode("<MD3Root>");
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    // Attach tiny children for all tags
    if (pcHeader->NUM_TAGS) {
        pScene->mRootNode->mNumChildren = pcHeader->NUM_TAGS;
        pScene->mRootNode->mChildren = new aiNode*[pcHeader->NUM_TAGS];

        for (unsigned int i = 0; i < pcHeader->NUM_TAGS; ++i, ++pcTags) {
            aiNode* nd = pScene->mRootNode->mChildren[i] = new aiNode();
            nd->mName.Set((const char*)pcTags->NAME);
            nd->mParent = pScene->mRootNode;

            AI_SWAP4(pcTags->origin.x);
            AI_SWAP4(pcTags->origin.y);
            AI_SWAP4(pcTags->origin.z);

            // Copy local origin, again flip z,y
            nd->mTransformation.a4 = pcTags->origin.x;
            nd->mTransformation.b4 = pcTags->origin.y;
            nd->mTransformation.c4 = pcTags->origin.z;

            // Copy rest of transformation (need to transpose to match row-order matrix)
            for (unsigned int a = 0; a < 3;++a) {
                for (unsigned int m = 0; m < 3;++m) {
                    nd->mTransformation[m][a] = pcTags->orientation[a][m];
                    AI_SWAP4(nd->mTransformation[m][a]);
                }
            }
        }
    }

    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mRootNode->mMeshes[i] = i;

    // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(
        1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,
        0.f,-1.f,0.f,0.f,
        0.f,0.f,0.f,1.f
    );
}